

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::SetTestLoad(cmCTestMultiProcessHandler *this,unsigned_long load)

{
  bool bVar1;
  string fake_load_value;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  this->TestLoad = load;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",&local_48);
  if (bVar1) {
    bVar1 = cmStrToULong(&local_48,&this->FakeLoadForTesting);
    if (!bVar1) {
      std::operator+(&local_28,"Failed to parse fake load value: ",&local_48);
      cmSystemTools::Error(&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetTestLoad(unsigned long load)
{
  this->TestLoad = load;

  std::string fake_load_value;
  if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                            fake_load_value)) {
    if (!cmStrToULong(fake_load_value, &this->FakeLoadForTesting)) {
      cmSystemTools::Error("Failed to parse fake load value: " +
                           fake_load_value);
    }
  }
}